

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall
crnd::crn_unpacker::unpack_etc1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  crn_header *pcVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  crn_unpacker *pcVar13;
  undefined4 in_register_00000084;
  symbol_codec *this_00;
  byte bVar14;
  block_buffer_element *pbVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  uint8 e1 [4];
  uint8 e0 [4];
  uint8 block_endpoint [4];
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint32 local_b8;
  uint local_b4;
  uint local_b0;
  undefined4 local_ac;
  crn_unpacker *local_a8;
  uint local_9c;
  vector<crnd::crn_unpacker::block_buffer_element> *local_98;
  undefined8 local_90;
  ulong local_88;
  static_huffman_data_model *local_80;
  uint8 *local_78;
  uint8 **local_70;
  ulong local_68;
  long local_60;
  static_huffman_data_model *local_58;
  ulong local_50;
  ulong local_48;
  static_huffman_data_model *local_40;
  symbol_codec *local_38;
  
  local_90 = CONCAT44(in_register_00000084,output_height);
  local_b8 = (this->m_color_endpoints).m_size;
  uVar10 = (this->m_block_buffer).m_size;
  uVar6 = output_width + 1 & 0xfffffffe;
  local_88 = (ulong)uVar6;
  uVar9 = uVar6 * 2;
  local_98 = &this->m_block_buffer;
  local_a8 = this;
  local_70 = pDst;
  if (uVar10 < uVar9) {
    if ((uVar9 <= (this->m_block_buffer).m_capacity) ||
       (bVar1 = elemental_vector::increase_capacity
                          ((elemental_vector *)local_98,uVar9,uVar10 + 1 == uVar9,8,
                           (object_mover)0x0), bVar1)) {
      (local_a8->m_block_buffer).m_size = uVar9;
    }
    else {
      (local_a8->m_block_buffer).m_alloc_failed = true;
    }
  }
  pcVar5 = local_a8->m_pHeader;
  if ((pcVar5->m_faces).m_buf[0] != '\0') {
    local_bc = (int)local_90 + 1U & 0xfffffffe;
    this_00 = &local_a8->m_codec;
    local_58 = &local_a8->m_reference_encoding_dm;
    local_80 = local_a8->m_endpoint_delta_dm;
    local_40 = local_a8->m_selector_delta_dm;
    local_60 = (long)(int)((output_pitch_in_bytes >> 2) + uVar6 * -2);
    local_48 = (ulong)output_width;
    local_50 = local_88 & 0xffffffff;
    local_68 = 0;
    uVar10 = 0;
    local_b4 = 0;
    pcVar13 = local_a8;
    local_38 = this_00;
    do {
      if (local_bc != 0) {
        local_78 = local_70[local_68];
        local_c4 = 0;
        do {
          if ((int)local_88 != 0) {
            bVar1 = local_c4 < (uint)local_90;
            pbVar15 = local_98->m_p;
            uVar16 = 0;
            do {
              bVar17 = uVar16 < local_48;
              uVar7 = (ulong)(uint)((int)uVar16 * 2);
              if ((local_c4 & 1) != 0) {
                uVar9 = (uint)(byte)pbVar15[uVar7].endpoint_reference;
                switch(uVar9 & 3) {
                case 1:
                  goto switchD_0011525b_caseD_1;
                case 2:
                  goto switchD_0011525b_caseD_2;
                case 3:
                  goto switchD_0011525b_caseD_3;
                }
switchD_0011525b_caseD_0:
                uVar3 = symbol_codec::decode(this_00,local_80);
                uVar2 = local_b8;
                if (uVar3 + uVar10 < local_b8) {
                  uVar2 = 0;
                }
                uVar10 = (uVar3 + uVar10) - uVar2;
                pcVar13 = local_a8;
                goto LAB_001152bb;
              }
              uVar2 = symbol_codec::decode(this_00,local_58);
              uVar9 = uVar2 >> 2 & 0xc;
              pbVar15[uVar7].endpoint_reference =
                   (ushort)(uVar2 >> 4) & 0xc | (ushort)(uVar2 >> 2) & 3;
              pcVar13 = local_a8;
              switch(uVar2 & 3) {
              case 0:
                goto switchD_0011525b_caseD_0;
              case 1:
switchD_0011525b_caseD_1:
                break;
              case 2:
switchD_0011525b_caseD_2:
                uVar10 = (uint)pbVar15[uVar7].color_endpoint_index;
                goto LAB_001152c1;
              case 3:
switchD_0011525b_caseD_3:
                uVar10 = local_b4;
              }
LAB_001152bb:
              pbVar15[uVar7].color_endpoint_index = (uint16)uVar10;
LAB_001152c1:
              uVar11 = (ulong)uVar10;
              local_b0 = (pcVar13->m_color_endpoints).m_p[uVar11];
              local_9c = local_b0;
              uVar2 = symbol_codec::decode(this_00,local_40);
              if ((uVar9 & 0xfc) != 0) {
                uVar4 = symbol_codec::decode(this_00,local_80);
                uVar3 = local_b8;
                if (uVar4 + uVar10 < local_b8) {
                  uVar3 = 0;
                }
                uVar10 = (uVar4 + uVar10) - uVar3;
                uVar11 = (ulong)uVar10;
              }
              bVar1 = (bool)(bVar1 & bVar17);
              pbVar15 = (local_a8->m_block_buffer).m_p;
              local_b4 = (uint)pbVar15[uVar7 | 1].color_endpoint_index;
              pbVar15[uVar7 + 1].color_endpoint_index = (uint16)uVar10;
              local_c0 = (local_a8->m_color_endpoints).m_p[uVar11];
              if (bVar1) {
                uVar7 = 0;
                do {
                  bVar17 = (uint)*(byte *)((long)&local_c0 + uVar7) <=
                           *(byte *)((long)&local_b0 + uVar7) + 3;
                  bVar18 = (uint)*(byte *)((long)&local_b0 + uVar7) <=
                           *(byte *)((long)&local_c0 + uVar7) + 4;
                  if (!bVar18 || !bVar17) break;
                  bVar19 = uVar7 < 2;
                  uVar7 = uVar7 + 1;
                } while (bVar19);
                lVar8 = 0;
                do {
                  bVar12 = *(char *)((long)&local_b0 + lVar8) * '\b';
                  if (bVar18 && bVar17) {
                    bVar14 = *(char *)((long)&local_c0 + lVar8) - *(char *)((long)&local_b0 + lVar8)
                             & 7;
                  }
                  else {
                    bVar12 = bVar12 & 0xf0;
                    bVar14 = *(byte *)((long)&local_c0 + lVar8) >> 1;
                  }
                  *(byte *)((long)&local_ac + lVar8) = bVar14 | bVar12;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                uVar9 = uVar9 >> 3 ^ 1;
                local_ac = CONCAT13(((byte)(local_c0 >> 0x16) & 0xfc |
                                    (byte)(local_9c >> 0x13) & 0xe0) + (bVar18 && bVar17) * '\x02' |
                                    (byte)uVar9,(undefined3)local_ac);
                *(undefined4 *)local_78 = local_ac;
                *(uint *)(local_78 + 4) = (local_a8->m_color_selectors).m_p[uVar2 * 2 | uVar9];
              }
              uVar16 = uVar16 + 1;
              local_78 = local_78 + 8;
              pcVar13 = local_a8;
              this_00 = local_38;
            } while (uVar16 != local_50);
          }
          local_c4 = local_c4 + 1;
          local_78 = local_78 + local_60 * 4;
        } while (local_c4 != local_bc);
        pcVar5 = pcVar13->m_pHeader;
      }
      local_68 = local_68 + 1;
    } while (local_68 < (pcVar5->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_etc1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_color_endpoints = m_color_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

            if (m_block_buffer.size() < width << 1)
                m_block_buffer.resize(width << 1);

            uint32 color_endpoint_index = 0, diagonal_color_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 2)
                    {
                        visible = visible && x < output_width;
                        block_buffer_element& buffer = m_block_buffer[x << 1];
                        uint8 endpoint_reference, block_endpoint[4], e0[4], e1[4];
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                            endpoint_reference = (reference_group & 3) | (reference_group >> 2 & 12);
                            buffer.endpoint_reference = (reference_group >> 2 & 3) | (reference_group >> 4 & 12);
                        }
                        if (!(endpoint_reference & 3))
                        {
                            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
                            if (color_endpoint_index >= num_color_endpoints)
                                color_endpoint_index -= num_color_endpoints;
                            buffer.color_endpoint_index = color_endpoint_index;
                        }
                        else if ((endpoint_reference & 3) == 1)
                        {
                            buffer.color_endpoint_index = color_endpoint_index;
                        }
                        else if ((endpoint_reference & 3) == 3)
                        {
                            buffer.color_endpoint_index = color_endpoint_index = diagonal_color_endpoint_index;
                        }
                        else
                        {
                            color_endpoint_index = buffer.color_endpoint_index;
                        }
                        endpoint_reference >>= 2;
                        *(uint32*)&e0 = m_color_endpoints[color_endpoint_index];
                        uint32 selector_index = m_codec.decode(m_selector_delta_dm[0]);
                        if (endpoint_reference)
                        {
                            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
                            if (color_endpoint_index >= num_color_endpoints)
                                color_endpoint_index -= num_color_endpoints;
                        }
                        diagonal_color_endpoint_index = m_block_buffer[x << 1 | 1].color_endpoint_index;
                        m_block_buffer[x << 1 | 1].color_endpoint_index = color_endpoint_index;
                        *(uint32*)&e1 = m_color_endpoints[color_endpoint_index];
                        if (visible)
                        {
                            uint32 flip = endpoint_reference >> 1 ^ 1, diff = 1;
                            for (uint c = 0; diff && c < 3; c++)
                                diff = e0[c] + 3 >= e1[c] && e1[c] + 4 >= e0[c] ? diff : 0;
                            for (uint c = 0; c < 3; c++)
                                block_endpoint[c] = diff ? e0[c] << 3 | ((e1[c] - e0[c]) & 7) : (e0[c] << 3 & 0xF0) | e1[c] >> 1;
                            block_endpoint[3] = e0[3] << 5 | e1[3] << 2 | diff << 1 | flip;
                            pData[0] = *(uint32*)&block_endpoint;
                            pData[1] = m_color_selectors[selector_index << 1 | flip];
                        }
                    }
                }
            }
            return true;
        }